

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

type * check_declarator(c2m_ctx_t c2m_ctx,node_t_conflict r,int func_def_p)

{
  uchar uVar1;
  node_code_t nVar2;
  check_ctx *pcVar3;
  int iVar4;
  node_t_conflict pnVar5;
  node_t_conflict pnVar6;
  type *el;
  node_t_conflict r_00;
  arr_type *paVar7;
  func_type *pfVar8;
  decl_spec *pdVar9;
  pos_t pVar10;
  bool local_ed;
  char *local_e8;
  undefined8 local_e0;
  decl_spec *decl_spec_ptr;
  node_t_conflict p;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  decl_spec *ds;
  int saved_in_params_p;
  node_t_conflict last;
  node_t_conflict param_list;
  node_t_conflict first_param;
  func_type *func_type;
  node_t_conflict size;
  node_t_conflict type_qual_1;
  node_t_conflict static_node;
  arr_type *arr_type;
  node_t_conflict type_qual;
  node_t_conflict n;
  node_t_conflict list;
  type *res;
  type *type;
  check_ctx_t check_ctx;
  int func_def_p_local;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  pcVar3 = c2m_ctx->check_ctx;
  list = (node_t_conflict)0x0;
  pnVar5 = DLIST_node_t_el(&(r->u).ops,1);
  if (r->code != N_DECL) {
    __assert_fail("r->code == N_DECL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1b49,"struct type *check_declarator(c2m_ctx_t, node_t, int)");
  }
  pnVar6 = DLIST_node_t_head(&(pnVar5->u).ops);
  if (pnVar6 == (node_t_conflict)0x0) {
    c2m_ctx_local = (c2m_ctx_t)0x0;
  }
  else {
    for (type_qual = DLIST_node_t_head(&(pnVar5->u).ops); type_qual != (node_t_conflict)0x0;
        type_qual = DLIST_node_t_next(type_qual)) {
      el = create_type(c2m_ctx,(type *)0x0);
      el->pos_node = type_qual;
      nVar2 = type_qual->code;
      if (nVar2 == N_FUNC) {
        pnVar5 = DLIST_node_t_head(&(type_qual->u).ops);
        pnVar6 = DLIST_node_t_tail(&(pnVar5->u).ops);
        uVar1 = pcVar3->in_params_p;
        el->mode = TM_FUNC;
        el->pos_node = type_qual;
        pfVar8 = (func_type *)reg_malloc(c2m_ctx,0x20);
        (el->u).func_type = pfVar8;
        pfVar8->ret_type = (type *)0x0;
        pfVar8->proto_item = (MIR_item_t)0x0;
        local_ed = false;
        if (pnVar6 != (node_t_conflict)0x0) {
          local_ed = pnVar6->code == N_DOTS;
        }
        *(byte *)pfVar8 = *(byte *)pfVar8 & 0xfe | local_ed;
        if (local_ed != false) {
          DLIST_node_t_remove(&(pnVar5->u).ops,pnVar6);
        }
        if (func_def_p == 0) {
          create_node_scope(c2m_ctx,type_qual);
        }
        pfVar8->param_list = pnVar5;
        pcVar3->in_params_p = '\x01';
        pnVar5 = DLIST_node_t_head(&(pnVar5->u).ops);
        if ((pnVar5 != (node_t_conflict)0x0) && (pnVar5->code != N_ID)) {
          check(c2m_ctx,pnVar5,type_qual);
        }
        iVar4 = void_param_p(pnVar5);
        decl_spec_ptr = (decl_spec *)pnVar5;
        if (iVar4 == 0) {
          for (; decl_spec_ptr != (decl_spec *)0x0;
              decl_spec_ptr = (decl_spec *)DLIST_node_t_next((node_t_conflict)decl_spec_ptr)) {
            if (*(int *)decl_spec_ptr == 0x10) {
              if (func_def_p == 0) {
                pVar10 = get_node_pos(c2m_ctx,(node_t_conflict)decl_spec_ptr);
                local_e8 = pVar10.fname;
                local_e0 = pVar10._8_8_;
                error(c2m_ctx,0x1d6a49,local_e8,local_e0);
              }
              break;
            }
            if ((node_t_conflict)decl_spec_ptr != pnVar5) {
              check(c2m_ctx,(node_t_conflict)decl_spec_ptr,type_qual);
            }
            pdVar9 = get_param_decl_spec((node_t_conflict)decl_spec_ptr);
            adjust_param_type(c2m_ctx,&pdVar9->type);
          }
        }
        else {
          pdVar9 = (decl_spec *)pnVar5->attr;
          iVar4 = non_reg_decl_spec_p(pdVar9);
          if (((iVar4 != 0) || ((*(byte *)pdVar9 >> 4 & 1) != 0)) ||
             (iVar4 = type_qual_eq_p(&pdVar9->type->type_qual,&zero_type_qual), iVar4 == 0)) {
            pVar10 = get_node_pos(c2m_ctx,pnVar5);
            local_b8 = pVar10.fname;
            local_b0 = pVar10._8_8_;
            error(c2m_ctx,0x1d6a10,local_b8,local_b0);
          }
          pnVar6 = DLIST_node_t_next(pnVar5);
          if (pnVar6 != (node_t_conflict)0x0) {
            pVar10 = get_node_pos(c2m_ctx,pnVar5);
            p = (node_t_conflict)pVar10.fname;
            local_c0 = pVar10._8_8_;
            error(c2m_ctx,0x1d6a29,(char *)p,local_c0);
          }
        }
        pcVar3->in_params_p = uVar1;
        if (func_def_p == 0) {
          finish_scope(c2m_ctx);
        }
      }
      else if (nVar2 == N_POINTER) {
        pnVar5 = DLIST_node_t_head(&(type_qual->u).ops);
        el->mode = TM_PTR;
        el->pos_node = type_qual;
        (el->u).tag_type = (node_t_conflict)0x0;
        set_type_qual(c2m_ctx,pnVar5,&el->type_qual,TM_PTR);
      }
      else {
        if (nVar2 != N_ARR) {
          abort();
        }
        pnVar5 = DLIST_node_t_head(&(type_qual->u).ops);
        pnVar6 = DLIST_node_t_next(pnVar5);
        r_00 = DLIST_node_t_next(pnVar6);
        el->mode = TM_ARR;
        el->pos_node = type_qual;
        paVar7 = (arr_type *)reg_malloc(c2m_ctx,0x20);
        (el->u).arr_type = paVar7;
        clear_type_qual(&paVar7->ind_type_qual);
        set_type_qual(c2m_ctx,pnVar6,&paVar7->ind_type_qual,TM_UNDEF);
        check(c2m_ctx,r_00,type_qual);
        paVar7->size = r_00;
        *(byte *)paVar7 = *(byte *)paVar7 & 0xfe | pnVar5->code == N_STATIC;
        paVar7->el_type = (type *)0x0;
      }
      list = (node_t_conflict)append_type((type *)list,el);
    }
    c2m_ctx_local = (c2m_ctx_t)list;
  }
  return (type *)c2m_ctx_local;
}

Assistant:

static struct type *check_declarator (c2m_ctx_t c2m_ctx, node_t r, int func_def_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  struct type *type, *res = NULL;
  node_t list = NL_EL (r->u.ops, 1);

  assert (r->code == N_DECL);
  if (NL_HEAD (list->u.ops) == NULL) return NULL;
  for (node_t n = NL_HEAD (list->u.ops); n != NULL; n = NL_NEXT (n)) {
    type = create_type (c2m_ctx, NULL);
    type->pos_node = n;
    switch (n->code) {
    case N_POINTER: {
      node_t type_qual = NL_HEAD (n->u.ops);

      type->mode = TM_PTR;
      type->pos_node = n;
      type->u.ptr_type = NULL;
      set_type_qual (c2m_ctx, type_qual, &type->type_qual, TM_PTR);
      break;
    }
    case N_ARR: {
      struct arr_type *arr_type;
      node_t static_node = NL_HEAD (n->u.ops);
      node_t type_qual = NL_NEXT (static_node);
      node_t size = NL_NEXT (type_qual);

      type->mode = TM_ARR;
      type->pos_node = n;
      type->u.arr_type = arr_type = reg_malloc (c2m_ctx, sizeof (struct arr_type));
      clear_type_qual (&arr_type->ind_type_qual);
      set_type_qual (c2m_ctx, type_qual, &arr_type->ind_type_qual, TM_UNDEF);
      check (c2m_ctx, size, n);
      arr_type->size = size;
      arr_type->static_p = static_node->code == N_STATIC;
      arr_type->el_type = NULL;
      break;
    }
    case N_FUNC: {
      struct func_type *func_type;
      node_t first_param, param_list = NL_HEAD (n->u.ops);
      node_t last = NL_TAIL (param_list->u.ops);
      int saved_in_params_p = in_params_p;

      type->mode = TM_FUNC;
      type->pos_node = n;
      type->u.func_type = func_type = reg_malloc (c2m_ctx, sizeof (struct func_type));
      func_type->ret_type = NULL;
      func_type->proto_item = NULL;
      if ((func_type->dots_p = last != NULL && last->code == N_DOTS))
        NL_REMOVE (param_list->u.ops, last);
      if (!func_def_p) create_node_scope (c2m_ctx, n);
      func_type->param_list = param_list;
      in_params_p = TRUE;
      first_param = NL_HEAD (param_list->u.ops);
      if (first_param != NULL && first_param->code != N_ID) check (c2m_ctx, first_param, n);
      if (void_param_p (first_param)) {
        struct decl_spec *ds = first_param->attr;

        if (non_reg_decl_spec_p (ds) || ds->register_p
            || !type_qual_eq_p (&ds->type->type_qual, &zero_type_qual)) {
          error (c2m_ctx, POS (first_param), "qualified void parameter");
        }
        if (NL_NEXT (first_param) != NULL) {
          error (c2m_ctx, POS (first_param), "void must be the only parameter");
        }
      } else {
        for (node_t p = first_param; p != NULL; p = NL_NEXT (p)) {
          struct decl_spec *decl_spec_ptr;

          if (p->code == N_ID) {
            if (!func_def_p)
              error (c2m_ctx, POS (p),
                     "parameters identifier list can be only in function definition");
            break;
          } else {
            if (p != first_param) check (c2m_ctx, p, n);
            decl_spec_ptr = get_param_decl_spec (p);
            adjust_param_type (c2m_ctx, &decl_spec_ptr->type);
          }
        }
      }
      in_params_p = saved_in_params_p;
      if (!func_def_p) finish_scope (c2m_ctx);
      break;
    }
    default: abort ();
    }
    res = append_type (res, type);
  }
  return res;
}